

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O0

double __thiscall sector_t::FindLowestCeilingPoint(sector_t *this,vertex_t **v)

{
  line_t *plVar1;
  bool bVar2;
  double dVar3;
  vertex_t *local_48;
  vertex_t *spot;
  double probeheight;
  double height;
  line_t *line;
  int i;
  vertex_t **v_local;
  sector_t *this_local;
  
  probeheight = 3.4028234663852886e+38;
  local_48 = (vertex_t *)0x0;
  bVar2 = secplane_t::isSlope(&this->ceilingplane);
  if (bVar2) {
    for (line._4_4_ = 0; line._4_4_ < this->linecount; line._4_4_ = line._4_4_ + 1) {
      plVar1 = this->lines[line._4_4_];
      dVar3 = secplane_t::ZatPoint(&this->ceilingplane,plVar1->v1);
      if (dVar3 < probeheight) {
        local_48 = plVar1->v1;
        probeheight = dVar3;
      }
      dVar3 = secplane_t::ZatPoint(&this->ceilingplane,plVar1->v2);
      if (dVar3 < probeheight) {
        local_48 = plVar1->v2;
        probeheight = dVar3;
      }
    }
    if (v != (vertex_t **)0x0) {
      *v = local_48;
    }
    this_local = (sector_t *)probeheight;
  }
  else {
    if (v != (vertex_t **)0x0) {
      if (this->linecount == 0) {
        *v = vertexes;
      }
      else {
        *v = (*this->lines)->v1;
      }
    }
    this_local = (sector_t *)secplane_t::fD(&this->ceilingplane);
  }
  return (double)this_local;
}

Assistant:

double sector_t::FindLowestCeilingPoint (vertex_t **v) const
{
	int i;
	line_t *line;
	double height = FLT_MAX;
	double probeheight;
	vertex_t *spot = NULL;

	if (!ceilingplane.isSlope())
	{
		if (v != NULL)
		{
			if (linecount == 0) *v = &vertexes[0];
			else *v = lines[0]->v1;
		}
		return ceilingplane.fD();
	}

	for (i = 0; i < linecount; i++)
	{
		line = lines[i];
		probeheight = ceilingplane.ZatPoint(line->v1);
		if (probeheight < height)
		{
			height = probeheight;
			spot = line->v1;
		}
		probeheight = ceilingplane.ZatPoint(line->v2);
		if (probeheight < height)
		{
			height = probeheight;
			spot = line->v2;
		}
	}
	if (v != NULL)
		*v = spot;
	return height;
}